

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O3

char * glu::getMemoryAccessQualifierName(MemoryAccessQualifier qualifier)

{
  switch(qualifier) {
  case MEMORYACCESSQUALIFIER_COHERENT_BIT:
    return "coherent";
  case MEMORYACCESSQUALIFIER_VOLATILE_BIT:
    return "volatile";
  case MEMORYACCESSQUALIFIER_VOLATILE_BIT|MEMORYACCESSQUALIFIER_COHERENT_BIT:
  case MEMORYACCESSQUALIFIER_RESTRICT_BIT|MEMORYACCESSQUALIFIER_COHERENT_BIT:
  case MEMORYACCESSQUALIFIER_RESTRICT_BIT|MEMORYACCESSQUALIFIER_VOLATILE_BIT:
  case MEMORYACCESSQUALIFIER_RESTRICT_BIT|MEMORYACCESSQUALIFIER_VOLATILE_BIT|
       MEMORYACCESSQUALIFIER_COHERENT_BIT:
    goto switchD_00a042d5_caseD_3;
  case MEMORYACCESSQUALIFIER_RESTRICT_BIT:
    return "restrict";
  case MEMORYACCESSQUALIFIER_READONLY_BIT:
    return "readonly";
  default:
    if (qualifier == MEMORYACCESSQUALIFIER_WRITEONLY_BIT) {
      return "writeonly";
    }
switchD_00a042d5_caseD_3:
    return (char *)0x0;
  }
}

Assistant:

const char* getMemoryAccessQualifierName (MemoryAccessQualifier qualifier)
{
	switch (qualifier)
	{
		case MEMORYACCESSQUALIFIER_COHERENT_BIT:	return "coherent";
		case MEMORYACCESSQUALIFIER_VOLATILE_BIT:	return "volatile";
		case MEMORYACCESSQUALIFIER_RESTRICT_BIT:	return "restrict";
		case MEMORYACCESSQUALIFIER_READONLY_BIT:	return "readonly";
		case MEMORYACCESSQUALIFIER_WRITEONLY_BIT:	return "writeonly";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}